

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-mod-info.cc
# Opt level: O1

int main(int argc,char **argv)

{
  element_type *peVar1;
  char *pcVar2;
  size_type sVar3;
  undefined8 uVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  undefined4 extraout_var;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  long *plVar11;
  undefined8 *puVar12;
  ostream *poVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **pp_Var14;
  char **ppcVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  bool bVar17;
  char **ppcVar18;
  QPDFWriter w;
  QPDF file;
  QPDFObjectHandle filetrailer;
  string cur_key;
  QPDFObjectHandle fileinfo;
  string fl_tmp;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  Keys;
  QPDFObjectHandle local_158;
  long local_148;
  undefined8 uStack_140;
  QPDF local_130 [8];
  char **local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  long lStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  char **local_70;
  char **local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pcVar8 = (char *)QUtil::getWhoami(*argv);
  whoami = pcVar8;
  if (argc == 3) {
    iVar6 = strcmp(argv[1],"--dump");
    if (iVar6 != 0) goto LAB_00103b1c;
  }
  else {
    if ((argc == 2) && (iVar6 = strcmp(argv[1],"--version"), iVar6 == 0)) {
      poVar13 = std::operator<<((ostream *)&std::cout,pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," version ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"1.1",3);
      std::endl<char,std::char_traits<char>>(poVar13);
      goto LAB_001042ba;
    }
LAB_00103b1c:
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100._M_string_length = 0;
    local_100.field_2._M_local_buf[0] = '\0';
    if (argc < 2) {
      local_e0 = 0;
      ppcVar15 = (char **)0x0;
      ppcVar18 = (char **)0x0;
    }
    else {
      iVar6 = 1;
      local_e0 = 0;
      local_128 = (char **)0x0;
      local_70 = (char **)0x0;
      local_68 = argv;
      do {
        iVar7 = strcmp(argv[iVar6],"--in");
        if ((iVar7 == 0) && (iVar6 = iVar6 + 1, iVar6 < argc)) {
          local_70 = (char **)argv[iVar6];
        }
        else {
          iVar7 = strcmp(argv[iVar6],"--out");
          if ((iVar7 == 0) && (iVar6 = iVar6 + 1, iVar6 < argc)) {
            local_128 = (char **)argv[iVar6];
          }
          else {
            pcVar8 = argv[iVar6];
            iVar7 = strcmp(pcVar8,"--static-id");
            if (iVar7 == 0) {
              local_e0 = CONCAT71((int7)(CONCAT44(extraout_var,iVar7) >> 8),1);
            }
            else {
              iVar7 = strcmp(pcVar8,"--key");
              sVar3 = local_100._M_string_length;
              if ((iVar7 == 0) && (iVar6 = iVar6 + 1, iVar6 < argc)) {
                pcVar8 = argv[iVar6];
                strlen(pcVar8);
                std::__cxx11::string::_M_replace((ulong)&local_100,0,(char *)sVar3,(ulong)pcVar8);
                if (((char *)local_100._M_string_length == (char *)0x0) ||
                   (*local_100._M_dataplus._M_p != '/')) {
                  std::operator+(&local_90,"/",&local_100);
                  std::__cxx11::string::operator=((string *)&local_100,(string *)&local_90);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_90._M_dataplus._M_p != &local_90.field_2) {
                    operator_delete(local_90._M_dataplus._M_p,
                                    local_90.field_2._M_allocated_capacity + 1);
                  }
                }
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&local_60,&local_100);
                std::__cxx11::string::_M_replace
                          ((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x105105);
              }
              else {
                iVar7 = strcmp(argv[iVar6],"--val");
                if ((iVar7 != 0) ||
                   ((iVar6 = iVar6 + 1, argc <= iVar6 ||
                    ((char *)local_100._M_string_length == (char *)0x0)))) {
                  usage();
                  goto LAB_001042ac;
                }
                pcVar8 = argv[iVar6];
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&local_60,&local_100);
                pcVar2 = (char *)pmVar9->_M_string_length;
                strlen(pcVar8);
                argv = local_68;
                std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar2,(ulong)pcVar8);
                local_100._M_string_length = 0;
                *local_100._M_dataplus._M_p = '\0';
              }
            }
          }
        }
        iVar6 = iVar6 + 1;
        ppcVar15 = local_128;
        ppcVar18 = local_70;
      } while (iVar6 < argc);
    }
    argv = ppcVar18;
    if (ppcVar18 != (char **)0x0) {
      if (ppcVar15 == (char **)0x0) {
        ppcVar15 = ppcVar18;
      }
      if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,(char *)ppcVar15,(allocator<char> *)&local_158);
        std::__cxx11::string::append((char *)&local_90);
        QPDF::QPDF(local_130);
        QPDF::processFile((char *)local_130,(char *)ppcVar18);
        local_128 = ppcVar15;
        QPDF::getTrailer();
        local_d8._0_8_ = (element_type *)0x0;
        local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        bVar17 = SUB81(&local_158,0);
        if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_60._M_impl.super__Rb_tree_header) {
          p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            if ((element_type *)local_d8._0_8_ == (element_type *)0x0) {
              local_158.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)&local_148;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Info","");
              cVar5 = QPDFObjectHandle::hasKey((string *)&local_120);
              if (local_158.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)&local_148) {
                operator_delete(local_158.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                                local_148 + 1);
              }
              if (cVar5 == '\0') {
                QPDFObjectHandle::newDictionary();
                uVar4 = local_d8._8_8_;
                local_d8._8_8_ =
                     local_158.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
                local_d8._0_8_ =
                     local_158.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_158.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                local_158.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
                }
                if (local_158.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_158.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
                }
                local_158.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)&local_148;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Info","");
                QPDFObjectHandle::replaceKey((string *)&local_120,&local_158);
              }
              else {
                local_158.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)&local_148;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Info","");
                QPDFObjectHandle::getKey((string *)&local_b8);
                p_Var16 = p_Stack_b0;
                local_d8._0_8_ = local_b8;
                uVar4 = local_d8._8_8_;
                local_b8 = (element_type *)0x0;
                p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_d8._8_8_ = p_Var16;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
                }
                if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
                }
              }
              if (local_158.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)&local_148) {
                operator_delete(local_158.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                                local_148 + 1);
              }
            }
            iVar6 = std::__cxx11::string::compare((char *)(p_Var10 + 2));
            if (iVar6 == 0) {
              QPDFObjectHandle::removeKey((string *)local_d8);
            }
            else {
              QPDFObjectHandle::newString((string *)&local_158);
              QPDFObjectHandle::makeDirect(bVar17);
              QPDFObjectHandle::replaceKey((string *)local_d8,(QPDFObjectHandle *)(p_Var10 + 1));
              if (local_158.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_158.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
            }
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
          } while ((_Rb_tree_header *)p_Var10 != &local_60._M_impl.super__Rb_tree_header);
        }
        QPDFWriter::QPDFWriter((QPDFWriter *)&local_158,local_130,local_90._M_dataplus._M_p);
        QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&local_158);
        ppcVar15 = local_128;
        QPDFWriter::setLinearization(bVar17);
        QPDFWriter::setStaticID(bVar17);
        QPDFWriter::write();
        if (local_158.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_158.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
        }
        if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
        }
        QPDF::~QPDF(local_130);
        remove((char *)ppcVar15);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,"rename ",&local_90);
        plVar11 = (long *)std::__cxx11::string::append(local_d8);
        pp_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar11 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar11 == pp_Var14) {
          local_110 = *pp_Var14;
          lStack_108 = plVar11[3];
          local_120 = &local_110;
        }
        else {
          local_110 = *pp_Var14;
          local_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar11;
        }
        local_118 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[1];
        *plVar11 = (long)pp_Var14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,(char *)ppcVar15,(allocator<char> *)local_130);
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
        if (local_120 != &local_110) {
          p_Var16 = local_110;
        }
        if (p_Var16 < p_Stack_b0 + (long)local_118) {
          p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
          if (local_b8 != (element_type *)local_a8) {
            p_Var16 = local_a8[0];
          }
          if (p_Stack_b0 + (long)local_118 <= p_Var16) {
            puVar12 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_120)
            ;
            goto LAB_00104175;
          }
        }
        puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_b8);
LAB_00104175:
        local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_148;
        peVar1 = (element_type *)(puVar12 + 2);
        if ((element_type *)*puVar12 == peVar1) {
          local_148 = *(long *)peVar1;
          uStack_140 = puVar12[3];
        }
        else {
          local_148 = *(long *)peVar1;
          local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)*puVar12;
        }
        local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar12[1];
        *puVar12 = peVar1;
        puVar12[1] = 0;
        *peVar1 = (element_type)0x0;
        iVar6 = rename(local_90._M_dataplus._M_p,(char *)ppcVar15);
        QUtil::os_wrapper((string *)&local_158,iVar6);
        if (local_158.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)&local_148) {
          operator_delete(local_158.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          local_148 + 1);
        }
        if (local_b8 != (element_type *)local_a8) {
          operator_delete(local_b8,(ulong)(local_a8[0] + 1));
        }
        if (local_120 != &local_110) {
          operator_delete(local_120,(ulong)(local_110 + 1));
        }
        if ((element_type *)local_d8._0_8_ != (element_type *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_,local_c8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,
                          CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                   local_100.field_2._M_local_buf[0]) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_60);
        return 0;
      }
    }
LAB_001042ac:
    usage();
  }
  pdfDumpInfoDict(argv[2]);
LAB_001042ba:
  exit(0);
}

Assistant:

int
main(int argc, char* argv[])
{
    bool static_id = false;
    std::map<std::string, std::string> Keys;

    whoami = QUtil::getWhoami(argv[0]);

    if ((argc == 2) && (!strcmp(argv[1], "--version"))) {
        std::cout << whoami << " version " << version << std::endl;
        exit(0);
    }
    if ((argc == 3) && (!strcmp(argv[1], "--dump"))) {
        QTC::TC("examples", "pdf-mod-info --dump");
        pdfDumpInfoDict(argv[2]);
        exit(0);
    }

    char* fl_in = nullptr;
    char* fl_out = nullptr;
    std::string cur_key;

    for (int i = 1; i < argc; ++i) {
        if ((!strcmp(argv[i], "--in")) && (++i < argc)) {
            fl_in = argv[i];
        } else if ((!strcmp(argv[i], "--out")) && (++i < argc)) {
            fl_out = argv[i];
        } else if (!strcmp(argv[i], "--static-id")) // don't document
        {
            static_id = true; // this should be used in test suites only
        } else if ((!strcmp(argv[i], "--key")) && (++i < argc)) {
            QTC::TC("examples", "pdf-mod-info -key");
            cur_key = argv[i];
            if (!((cur_key.length() > 0) && (cur_key.at(0) == '/'))) {
                cur_key = "/" + cur_key;
            }
            Keys[cur_key] = "";
        } else if ((!strcmp(argv[i], "--val")) && (++i < argc)) {
            if (cur_key.empty()) {
                QTC::TC("examples", "pdf-mod-info usage wrong val");
                usage();
            }
            QTC::TC("examples", "pdf-mod-info -val");
            Keys[cur_key] = argv[i];
            cur_key.clear();
        } else {
            QTC::TC("examples", "pdf-mod-info usage junk");
            usage();
        }
    }
    if (!fl_in) {
        QTC::TC("examples", "pdf-mod-info no in file");
        usage();
    }
    if (!fl_out) {
        QTC::TC("examples", "pdf-mod-info in-place");
        fl_out = fl_in;
    }
    if (Keys.size() == 0) {
        QTC::TC("examples", "pdf-mod-info no keys");
        usage();
    }

    std::string fl_tmp = fl_out;
    fl_tmp += ".tmp";

    try {
        QPDF file;
        file.processFile(fl_in);

        QPDFObjectHandle filetrailer = file.getTrailer();
        QPDFObjectHandle fileinfo;

        for (auto const& it: Keys) {
            if (!fileinfo) {
                if (filetrailer.hasKey("/Info")) {
                    QTC::TC("examples", "pdf-mod-info has info");
                    fileinfo = filetrailer.getKey("/Info");
                } else {
                    QTC::TC("examples", "pdf-mod-info file no info");
                    fileinfo = QPDFObjectHandle::newDictionary();
                    filetrailer.replaceKey("/Info", fileinfo);
                }
            }
            if (it.second == "") {
                fileinfo.removeKey(it.first);
            } else {
                QPDFObjectHandle elt = fileinfo.newString(it.second);
                elt.makeDirect();
                fileinfo.replaceKey(it.first, elt);
            }
        }
        QPDFWriter w(file, fl_tmp.c_str());
        w.setStreamDataMode(qpdf_s_preserve);
        w.setLinearization(true);
        w.setStaticID(static_id); // for testing only
        w.write();
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    try {
        (void)remove(fl_out);
        QUtil::os_wrapper(
            "rename " + fl_tmp + " " + std::string(fl_out), rename(fl_tmp.c_str(), fl_out));
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    return 0;
}